

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Resupply_Received_PDU::operator==
          (Resupply_Received_PDU *this,Resupply_Received_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Logistics_Header::operator!=(&this->super_Logistics_Header,&Value->super_Logistics_Header)
  ;
  if ((KVar1) || (this->m_ui8NumSupplyTypes != Value->m_ui8NumSupplyTypes)) {
    bVar2 = false;
  }
  else {
    bVar2 = std::operator!=(&this->m_vSupplies,&Value->m_vSupplies);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

KBOOL Resupply_Received_PDU::operator == ( const Resupply_Received_PDU & Value ) const
{
    if( Logistics_Header::operator  !=( Value ) )                  return false;
    if( m_ui8NumSupplyTypes         != Value.m_ui8NumSupplyTypes ) return false;
    if( m_vSupplies                 != Value.m_vSupplies )         return false;
    return true;
}